

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall embree::ISPCScene::ISPCScene(ISPCScene *this,RTCDevice device,TutorialScene *in)

{
  uint uVar1;
  pointer pRVar2;
  Node *pNVar3;
  pointer pRVar4;
  pointer pRVar5;
  RTCScene pRVar6;
  ISPCGeometry **ppIVar7;
  ISPCGeometry *pIVar8;
  ISPCMaterial **ppIVar9;
  ISPCMaterial *pIVar10;
  Light **ppLVar11;
  Light *pLVar12;
  ulong uVar13;
  ulong uVar14;
  size_t i;
  Ref<embree::SceneGraph::LightNode> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pRVar6 = (RTCScene)rtcNewScene(device);
  this->scene = pRVar6;
  this->tutorialScene = in;
  SceneGraph::opaque_geometry_destruction = deleteGeometry;
  ppIVar7 = (ISPCGeometry **)
            alignedUSMMalloc((long)(in->geometries).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->geometries).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,0x10,DEVICE_READ_ONLY);
  this->geometries = ppIVar7;
  uVar14 = 0;
  while( true ) {
    pRVar2 = (in->geometries).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(in->geometries).
                   super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 3;
    if (uVar13 <= uVar14) break;
    pNVar3 = pRVar2[uVar14].ptr;
    local_38.ptr = pNVar3;
    if (pNVar3 != (Node *)0x0) {
      (*(pNVar3->super_RefCount)._vptr_RefCount[2])(pNVar3);
    }
    pIVar8 = convertGeometry(device,in,&local_38);
    this->geometries[uVar14] = pIVar8;
    if (pNVar3 != (Node *)0x0) {
      (*(pNVar3->super_RefCount)._vptr_RefCount[3])(pNVar3);
    }
    uVar14 = uVar14 + 1;
  }
  this->numGeometries = (uint)uVar13;
  ppIVar9 = (ISPCMaterial **)
            alignedUSMMalloc((long)(in->materials).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->materials).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,0x10,DEVICE_READ_ONLY);
  this->materials = ppIVar9;
  uVar14 = 0;
  while( true ) {
    pRVar4 = (in->materials).
             super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(in->materials).
                   super__Vector_base<embree::Ref<embree::SceneGraph::MaterialNode>,_std::allocator<embree::Ref<embree::SceneGraph::MaterialNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 3;
    if (uVar13 <= uVar14) break;
    pIVar10 = (ISPCMaterial *)
              (**(code **)((long)((pRVar4[uVar14].ptr)->super_Node).super_RefCount._vptr_RefCount +
                          0x78))();
    this->materials[uVar14] = pIVar10;
    uVar14 = uVar14 + 1;
  }
  this->numMaterials = (uint)uVar13;
  ppLVar11 = (Light **)
             alignedUSMMalloc((long)(in->lights).
                                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(in->lights).
                                    super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0x10,DEVICE_READ_ONLY)
  ;
  this->lights = ppLVar11;
  this->numLights = 0;
  uVar14 = 0;
  while( true ) {
    pRVar5 = (in->lights).
             super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(in->lights).
                      super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 3) <= uVar14)
    break;
    (**(code **)((long)((pRVar5[uVar14].ptr)->super_Node).super_RefCount._vptr_RefCount + 0x90))
              (0,&local_40);
    pLVar12 = convertLight(&local_40);
    if (local_40.ptr != (LightNode *)0x0) {
      (*((local_40.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    if (pLVar12 != (Light *)0x0) {
      uVar1 = this->numLights;
      this->numLights = uVar1 + 1;
      this->lights[uVar1] = pLVar12;
    }
    uVar14 = uVar14 + 1;
  }
  return;
}

Assistant:

ISPCScene::ISPCScene(RTCDevice device, TutorialScene* in)
    : scene(rtcNewScene(device)), tutorialScene(in)
  {
    SceneGraph::opaque_geometry_destruction = (void(*)(void*)) deleteGeometry;

    geometries = (ISPCGeometry**) alignedUSMMalloc(sizeof(ISPCGeometry*)*in->geometries.size());

    for (size_t i=0; i<in->geometries.size(); i++)
      geometries[i] = convertGeometry(device,in,in->geometries[i]);
    numGeometries = unsigned(in->geometries.size());
    
    materials = (ISPCMaterial**) alignedUSMMalloc(sizeof(ISPCMaterial*)*in->materials.size());
    for (size_t i=0; i<in->materials.size(); i++)
      materials[i] = (ISPCMaterial*) in->materials[i]->material();
    numMaterials = unsigned(in->materials.size());
    
    lights = (Light**) alignedUSMMalloc(sizeof(Light*)*in->lights.size());
    numLights = 0;
    for (size_t i=0; i<in->lights.size(); i++)
    {
      Light* light = convertLight(in->lights[i]->get(0.0f));
      if (light) lights[numLights++] = light;
    }
  }